

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_plan_serialization.cpp
# Opt level: O0

void test_helper(string *sql,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *fixtures)

{
  idx_t iVar1;
  ulong uVar2;
  ParserOptions PVar3;
  bool bVar4;
  long lVar5;
  pointer pSVar6;
  type pCVar7;
  type pBVar8;
  pointer pLVar9;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
  optimized_plan;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> new_plan;
  Optimizer optimizer;
  type plan;
  Planner planner;
  string statement_sql;
  unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *statement;
  iterator __end1_1;
  iterator __begin1_1;
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
  *__range1_1;
  Parser p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fixture;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *__range1;
  Connection con;
  DuckDB db;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc48;
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  *this;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffc50;
  shared_ptr<duckdb::ClientContext,_true> *this_00;
  undefined1 local_2f0 [8];
  undefined1 local_2e8 [8];
  undefined1 local_2e0 [8];
  undefined1 local_2d8 [8];
  undefined1 local_2d0 [8];
  Optimizer local_2c8 [104];
  undefined1 local_260 [8];
  Planner local_258 [335];
  allocator local_109;
  string local_108 [32];
  reference local_e8;
  unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *local_e0;
  __normal_iterator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>_>
  local_d8;
  Parser *local_d0;
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  *local_c8;
  shared_ptr<duckdb::ClientContext,_true> *psStack_c0;
  vector<duckdb::ParserExtension,_true> *local_b8;
  Parser local_a8 [48];
  string local_78 [8];
  reference local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60 [4];
  Connection local_40 [32];
  DuckDB local_20 [32];
  
  duckdb::DuckDB::DuckDB(local_20,(char *)0x0,(DBConfig *)0x0);
  duckdb::Connection::Connection(local_40,local_20);
  local_60[0]._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Catch::clara::std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(in_stack_fffffffffffffc48);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Catch::clara::std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(in_stack_fffffffffffffc48);
  while( true ) {
    bVar4 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffc50,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffc48);
    if (!bVar4) break;
    local_70 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(local_60);
    duckdb::Connection::SendQuery(local_78);
    duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
    ~unique_ptr((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
                0x5b5c53);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(local_60);
  }
  local_c8 = (vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
              *)0x0;
  psStack_c0 = (shared_ptr<duckdb::ClientContext,_true> *)0x0;
  local_b8 = (vector<duckdb::ParserExtension,_true> *)0x0;
  duckdb::ParserOptions::ParserOptions((ParserOptions *)&local_c8);
  PVar3.max_expression_depth = (idx_t)psStack_c0;
  PVar3._0_8_ = local_c8;
  PVar3.extensions = local_b8;
  this = local_c8;
  this_00 = psStack_c0;
  duckdb::Parser::Parser(local_a8,PVar3);
  duckdb::Parser::ParseQuery((string *)local_a8);
  local_d0 = local_a8;
  local_d8._M_current =
       (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
       std::
       vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
       ::begin(this);
  local_e0 = (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
             std::
             vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
             ::end(this);
  while( true ) {
    bVar4 = __gnu_cxx::operator!=
                      ((__normal_iterator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>_>
                        *)this_00,
                       (__normal_iterator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>_>
                        *)this);
    if (!bVar4) break;
    local_e8 = __gnu_cxx::
               __normal_iterator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>_>
               ::operator*(&local_d8);
    duckdb::shared_ptr<duckdb::ClientContext,_true>::operator->(this_00);
    duckdb::TransactionContext::BeginTransaction();
    duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
    operator->((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
               this_00);
    lVar5 = std::__cxx11::string::c_str();
    pSVar6 = duckdb::
             unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
             operator->((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                         *)this_00);
    iVar1 = pSVar6->stmt_location;
    pSVar6 = duckdb::
             unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
             operator->((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                         *)this_00);
    uVar2 = pSVar6->stmt_length;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,(char *)(lVar5 + iVar1),uVar2,&local_109);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    pCVar7 = duckdb::shared_ptr<duckdb::ClientContext,_true>::operator*(this_00);
    duckdb::Planner::Planner(local_258,pCVar7);
    duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
    unique_ptr((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
               this_00,(unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                        *)this);
    duckdb::Planner::CreatePlan(local_258,local_260);
    duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
    ~unique_ptr((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *
                )0x5b5ec3);
    duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
    ::unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)this_00,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)this);
    pBVar8 = duckdb::shared_ptr<duckdb::Binder,_true>::operator*
                       ((shared_ptr<duckdb::Binder,_true> *)this_00);
    pCVar7 = duckdb::shared_ptr<duckdb::ClientContext,_true>::operator*(this_00);
    duckdb::Optimizer::Optimizer(local_2c8,pBVar8,pCVar7);
    duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
    ::unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)this_00,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)this);
    duckdb::Optimizer::Optimize(local_2d0,local_2c8,local_2d8);
    duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
    ::operator=((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 *)this_00,
                (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 *)this);
    duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
    ::~unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                   *)0x5b5f78);
    duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
    ::~unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                   *)0x5b5f85);
    pLVar9 = duckdb::
             unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)this_00);
    pCVar7 = duckdb::shared_ptr<duckdb::ClientContext,_true>::operator*(this_00);
    (**(code **)(*(long *)pLVar9 + 0x48))(local_2e0,pLVar9,pCVar7);
    duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
    ::unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)this_00,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)this);
    duckdb::Optimizer::Optimize(local_2e8,local_2c8,local_2f0);
    duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
    ::~unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                   *)0x5b600a);
    duckdb::shared_ptr<duckdb::ClientContext,_true>::operator->(this_00);
    duckdb::TransactionContext::Commit();
    duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
    ::~unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                   *)0x5b603e);
    duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
    ::~unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                   *)0x5b604b);
    duckdb::Optimizer::~Optimizer((Optimizer *)this_00);
    duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
    ::~unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                   *)0x5b6065);
    duckdb::Planner::~Planner((Planner *)this_00);
    std::__cxx11::string::~string(local_108);
    __gnu_cxx::
    __normal_iterator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>_>
    ::operator++(&local_d8);
  }
  duckdb::Parser::~Parser((Parser *)0x5b61f5);
  duckdb::Connection::~Connection(local_40);
  duckdb::DuckDB::~DuckDB(local_20);
  return;
}

Assistant:

static void test_helper(string sql, duckdb::vector<string> fixtures = duckdb::vector<string>()) {
	DuckDB db;
	Connection con(db);

	for (const auto &fixture : fixtures) {
		con.SendQuery(fixture);
	}

	Parser p;
	p.ParseQuery(sql);

	for (auto &statement : p.statements) {
		con.context->transaction.BeginTransaction();
		// Should that be the default "ToString"?
		string statement_sql(statement->query.c_str() + statement->stmt_location, statement->stmt_length);
		Planner planner(*con.context);
		planner.CreatePlan(std::move(statement));
		auto plan = std::move(planner.plan);

		Optimizer optimizer(*planner.binder, *con.context);

		plan = optimizer.Optimize(std::move(plan));

		// LogicalOperator's copy utilizes its serialize and deserialize methods
		auto new_plan = plan->Copy(*con.context);

		auto optimized_plan = optimizer.Optimize(std::move(new_plan));
		con.context->transaction.Commit();
	}
}